

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

void __thiscall djb::tab_r::extract_ndf(tab_r *this,brdf *brdf,int res)

{
  int iVar1;
  reference __v;
  size_t sVar2;
  double *pdVar3;
  size_type sVar4;
  const_reference pvVar5;
  reference pvVar6;
  vector<float,_std::allocator<float>_> *this_00;
  float_t fVar7;
  float fVar8;
  float_t fVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  float local_1ac;
  float local_174;
  float local_170;
  float local_16c;
  float local_168;
  int local_164;
  undefined1 local_160 [4];
  int i_2;
  vector<double,_std::allocator<double>_> v;
  float_t pm;
  float_t u_3;
  int k;
  double nint;
  float_t z_m;
  float_t zm;
  float_t tm;
  float_t u_2;
  double dk;
  int nk;
  int j;
  double kji_tmp;
  undefined1 local_100 [4];
  float_t frp_i;
  value_type frp;
  float_t z_i_1;
  float_t zi_1;
  float_t ti_1;
  float_t u_1;
  int i_1;
  pair<djb::vec3,_djb::vec3> local_c0;
  undefined1 local_a8 [8];
  vec3 wi;
  float_t z_i;
  float_t zi;
  float local_80;
  float_t ti;
  float_t u;
  int i;
  vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> frp_v;
  vector<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_> io;
  matrix km;
  double du;
  int cnt;
  int res_local;
  brdf *brdf_local;
  tab_r *this_local;
  
  iVar1 = res + -1;
  fVar7 = m_pi();
  matrix::matrix((matrix *)
                 &io.
                  super__Vector_base<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,iVar1);
  std::vector<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>::
  vector((vector<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
          *)&frp_v.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::vector
            ((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)&u);
  for (ti = 0.0; (int)ti < iVar1; ti = (float_t)((int)ti + 1)) {
    local_80 = (float)(int)ti / (float)iVar1;
    fVar8 = sqr<float>(&local_80);
    fVar9 = m_pi();
    fVar8 = fVar8 * fVar9 * 0.5;
    dVar10 = std::cos((double)(ulong)(uint)fVar8);
    wi.z = SUB84(dVar10,0);
    dVar10 = std::sin((double)(ulong)(uint)fVar8);
    wi.y = SUB84(dVar10,0);
    vec3::vec3((vec3 *)local_a8,wi.y,0.0,wi.z);
    std::pair<djb::vec3,_djb::vec3>::pair<djb::vec3_&,_djb::vec3_&,_true>
              (&local_c0,(vec3 *)local_a8,(vec3 *)local_a8);
    std::vector<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
    ::push_back((vector<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
                 *)&frp_v.
                    super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_c0);
  }
  (*brdf->_vptr_brdf[3])
            (&u_1,brdf,
             &frp_v.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::operator=
            ((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)&u,
             (vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)&u_1);
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector
            ((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)&u_1);
  for (ti_1 = 0.0; (int)ti_1 < iVar1; ti_1 = (float_t)((int)ti_1 + 1)) {
    zi_1 = (float)(int)ti_1 / (float)iVar1;
    fVar8 = sqr<float>(&zi_1);
    fVar9 = m_pi();
    fVar8 = fVar8 * fVar9 * 0.5;
    dVar10 = std::cos((double)(ulong)(uint)fVar8);
    dVar11 = std::sin((double)(ulong)(uint)fVar8);
    frp._M_data._4_4_ = SUB84(dVar11,0);
    __v = std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::operator[]
                    ((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)&u,
                     (long)(int)ti_1);
    std::valarray<float>::valarray((valarray<float> *)local_100,__v);
    fVar8 = std::valarray<float>::sum((valarray<float> *)local_100);
    sVar2 = std::valarray<float>::size((valarray<float> *)local_100);
    local_1ac = (float)sVar2;
    kji_tmp._4_4_ = fVar8 / local_1ac;
    _nk = (double)kji_tmp._4_4_ * ((double)fVar7 / (double)iVar1);
    for (dk._4_4_ = 0; dk._4_4_ < iVar1; dk._4_4_ = dk._4_4_ + 1) {
      dk._0_4_ = 0xb4;
      fVar9 = m_pi();
      _tm = ((double)fVar9 + (double)fVar9) / 180.0;
      zm = (float)dk._4_4_ / (float)iVar1;
      fVar8 = sqr<float>(&zm);
      fVar9 = m_pi();
      fVar8 = fVar8 * fVar9 * 0.5;
      dVar11 = std::cos((double)(ulong)(uint)fVar8);
      dVar12 = std::sin((double)(ulong)(uint)fVar8);
      _u_3 = 0.0;
      for (pm = 0.0; (int)pm < 0xb4; pm = (float_t)((int)pm + 1)) {
        fVar9 = m_pi();
        v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = ((float)(int)pm / 180.0 + (float)(int)pm / 180.0) * fVar9;
        fVar8 = frp._M_data._4_4_ * SUB84(dVar12,0);
        dVar13 = std::cos((double)(ulong)(uint)v.super__Vector_base<double,_std::allocator<double>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                               _4_4_);
        v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ = fVar8 * SUB84(dVar13,0) + SUB84(dVar10,0) * SUB84(dVar11,0);
        fVar8 = sat<float>((float *)&v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage);
        _u_3 = (double)fVar8 + _u_3;
      }
      dVar11 = _nk * _u_3 * _tm;
      fVar8 = zm * SUB84(dVar12,0);
      pdVar3 = matrix::operator()((matrix *)
                                  &io.
                                   super__Vector_base<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,dk._4_4_,
                                  (int)ti_1);
      *pdVar3 = dVar11 * (double)fVar8;
    }
    std::valarray<float>::~valarray((valarray<float> *)local_100);
  }
  matrix::eigenvector((vector<double,_std::allocator<double>_> *)local_160,
                      (matrix *)
                      &io.
                       super__Vector_base<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,4);
  for (local_164 = 0; iVar1 = local_164,
      sVar4 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)local_160), iVar1 < (int)sVar4;
      local_164 = local_164 + 1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_160,(long)local_164);
    local_168 = (float)*pvVar5;
    std::vector<float,_std::allocator<float>_>::push_back(&this->m_ndf,&local_168);
  }
  this_00 = &this->m_ndf;
  local_170 = 0.0;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](this_00,(long)(res + -2));
  fVar8 = *pvVar6;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](this_00,(long)(res + -3));
  local_174 = (fVar8 + fVar8) - *pvVar6;
  local_16c = max<float>(&local_170,&local_174);
  std::vector<float,_std::allocator<float>_>::push_back(this_00,&local_16c);
  fprintf(_stdout,"djb_verbose: NDF extraction complete\n");
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_160);
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector
            ((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)&u);
  std::vector<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>::
  ~vector((vector<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
           *)&frp_v.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  matrix::~matrix((matrix *)
                  &io.
                   super__Vector_base<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void tab_r::extract_ndf(const brdf &brdf, int res)
{
	const int cnt = res - 1;
	const double du = (double)m_pi() / cnt;
	matrix km(cnt);
	std::vector<brdf::io_pair> io;
	std::vector<brdf::value_type> frp_v;

	// evaluate all directions
	for (int i = 0; i < cnt; ++i) {
		float_t u = (float_t)i / (float_t)cnt;
		float_t ti = sqr(u) * m_pi() / 2;
		float_t zi = cos(ti), z_i = sin(ti);
		vec3 wi = vec3(z_i, 0, zi);

		io.push_back(brdf::io_pair(wi, wi));
	}
	frp_v = brdf.eval_batch(io);

	// build kernel
	for (int i = 0; i < cnt; ++i) {
		float_t u = (float_t)i / cnt;
		float_t ti = sqr(u) * m_pi() / 2;
		float_t zi = cos(ti), z_i = sin(ti);
		brdf::value_type frp = frp_v[i];
		float_t frp_i = frp.sum() / frp.size();//dot(frp, vec3(0.2126, 0.7152, 0.0722));
		double kji_tmp = (double)frp_i * du;

		for (int j = 0; j < cnt; ++j) {
			const int nk = 180;
			const double dk = 2 * (double)m_pi() / nk;
			float_t u = (float_t)j / cnt;
			float_t tm = sqr(u) * m_pi() / 2;
			float_t zm = cos(tm), z_m = sin(tm);
			double nint = 0;

			for (int k = 0; k < nk; ++k) {
				float_t u = (float_t)k / (float_t)nk;
				float_t pm = u * 2 * m_pi();

				nint+= (double)sat(z_i * z_m * cos(pm) + zi * zm);
			}
			nint*= dk;

			km(j, i) = kji_tmp * nint * (double)(u * z_m);
		}
	}

	// compute
	const std::vector<double> v = km.eigenvector(4);
	for (int i = 0; i < (int)v.size(); ++i)
		m_ndf.push_back(v[i]);
	m_ndf.push_back(max((float_t)0, 2 * m_ndf[cnt - 1] - m_ndf[cnt - 2]));

#ifndef NVERBOSE
	DJB_LOG("djb_verbose: NDF extraction complete\n");
#endif
}